

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall
ImTriangulator::IsEar(ImTriangulator *this,int i0,int i1,int i2,ImVec2 *v0,ImVec2 *v1,ImVec2 *v2)

{
  ImTriangulatorNode **ppIVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ImTriangulatorNode **ppIVar5;
  bool bVar6;
  
  lVar4 = (long)(this->_Reflexes).Size;
  bVar6 = lVar4 < 1;
  if (0 < lVar4) {
    ppIVar5 = (this->_Reflexes).Data;
    ppIVar1 = ppIVar5 + lVar4;
    do {
      iVar2 = (*ppIVar5)->Index;
      if ((((iVar2 != i2) && (iVar2 != i0)) && (iVar2 != i1)) &&
         (bVar3 = ImTriangleContainsPoint(v0,v1,v2,&(*ppIVar5)->Pos), bVar3)) {
        return bVar6;
      }
      ppIVar5 = ppIVar5 + 1;
      bVar6 = ppIVar5 >= ppIVar1;
    } while (ppIVar5 < ppIVar1);
  }
  return bVar6;
}

Assistant:

bool ImTriangulator::IsEar(int i0, int i1, int i2, const ImVec2& v0, const ImVec2& v1, const ImVec2& v2) const
{
    ImTriangulatorNode** p_end = _Reflexes.Data + _Reflexes.Size;
    for (ImTriangulatorNode** p = _Reflexes.Data; p < p_end; p++)
    {
        ImTriangulatorNode* reflex = *p;
        if (reflex->Index != i0 && reflex->Index != i1 && reflex->Index != i2)
            if (ImTriangleContainsPoint(v0, v1, v2, reflex->Pos))
                return false;
    }
    return true;
}